

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O3

shared_ptr<helics::Core>
helics::CoreFactory::create(CoreType type,string_view coreName,int argc,char **argv)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  HelicsException *this;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  CoreType type_00;
  undefined4 in_register_0000003c;
  shared_ptr<helics::Core> *core;
  string_view name;
  string_view message;
  shared_ptr<helics::Core> sVar8;
  string newName;
  int in_stack_ffffffffffffff44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  size_type *local_98;
  _Alloc_hider local_90;
  size_type local_88;
  char acStack_80 [8];
  undefined8 in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  core = (shared_ptr<helics::Core> *)CONCAT44(in_register_0000003c,type);
  pcVar6 = coreName._M_str;
  type_00 = (CoreType)coreName._M_len;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  if ((type_00 == EXTRACT) || (pcVar6 == (char *)0x0)) {
    helics::core::extractCoreType_abi_cxx11_
              (in_stack_ffffffffffffff44,(char **)in_stack_ffffffffffffff88);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
    if (local_90._M_p != acStack_80) {
      operator_delete(local_90._M_p,(long)acStack_80 + 1);
    }
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)local_b8._M_string_length;
    }
    if (type_00 == EXTRACT) {
      type_00 = (CoreType)local_98;
    }
  }
  name._M_len = (ulong)type_00;
  name._M_str = pcVar6;
  makeCore(type,name);
  peVar1 = (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_Core[3])(peVar1,(ulong)argv & 0xffffffff);
  bVar2 = registerCore(core,type_00);
  if (!bVar2) {
    this = (HelicsException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"core ","");
    iVar3 = (*((core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_Core[0xc])();
    std::operator+(&local_50,&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar3));
    pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_50," failed to register properly");
    local_98 = (size_type *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98 == paVar5) {
      local_88 = paVar5->_M_allocated_capacity;
      acStack_80 = *(char (*) [8])((long)&pbVar4->field_2 + 8);
      local_98 = &local_88;
    }
    else {
      local_88 = paVar5->_M_allocated_capacity;
    }
    local_90._M_p = (pointer)pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    message._M_str = (char *)local_98;
    message._M_len = (size_t)local_90._M_p;
    HelicsException::HelicsException(this,message);
    *(undefined ***)this = &PTR__HelicsException_004ba920;
    __cxa_throw(this,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  _Var7._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
    _Var7._M_pi = extraout_RDX_00;
  }
  sVar8.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi
  ;
  sVar8.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)core;
  return (shared_ptr<helics::Core>)
         sVar8.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> create(CoreType type, std::string_view coreName, int argc, char* argv[])
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || coreName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(argc, argv);
        if (coreName.empty() && !newName.empty()) {
            coreName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto core = makeCore(type, coreName);
    core->configureFromArgs(argc, argv);
    if (!registerCore(core, type)) {
        throw(helics::RegistrationFailure(std::string("core ") + core->getIdentifier() +
                                          " failed to register properly"));
    }

    return core;
}